

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O3

void __thiscall dg::LLVMPointerAnalysis::~LLVMPointerAnalysis(LLVMPointerAnalysis *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~LLVMPointerAnalysis() = default;